

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageOneofFieldGenerator::GenerateInlineAccessorDefinitions
          (MessageOneofFieldGenerator *this,Printer *printer)

{
  Formatter format;
  Formatter local_48;
  
  local_48.printer_ = printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_48.vars_._M_t,
             &(this->super_MessageFieldGenerator).super_FieldGenerator.variables_._M_t);
  Formatter::operator()<>
            (&local_48,
             "inline $type$* $classname$::$release_name$() {\n$annotate_release$  // @@protoc_insertion_point(field_release:$full_name$)\n  if (_internal_has_$name$()) {\n    clear_has_$oneof_name$();\n      $type$* temp = $field_member$;\n    if (GetArenaForAllocation() != nullptr) {\n      temp = ::$proto_ns$::internal::DuplicateIfNonNull(temp);\n    }\n    $field_member$ = nullptr;\n    return temp;\n  } else {\n    return nullptr;\n  }\n}\n"
            );
  Formatter::operator()<>
            (&local_48,
             "inline const $type$& $classname$::_internal_$name$() const {\n  return _internal_has_$name$()\n      ? *$field_member$\n      : reinterpret_cast< $type$&>($type_default_instance$);\n}\ninline const $type$& $classname$::$name$() const {\n$annotate_get$  // @@protoc_insertion_point(field_get:$full_name$)\n  return _internal_$name$();\n}\ninline $type$* $classname$::unsafe_arena_release_$name$() {\n$annotate_release$  // @@protoc_insertion_point(field_unsafe_arena_release:$full_name$)\n  if (_internal_has_$name$()) {\n    clear_has_$oneof_name$();\n    $type$* temp = $field_member$;\n    $field_member$ = nullptr;\n    return temp;\n  } else {\n    return nullptr;\n  }\n}\ninline void $classname$::unsafe_arena_set_allocated_$name$($type$* $name$) {\n  clear_$oneof_name$();\n  if ($name$) {\n    set_has_$name$();\n    $field_member$ = $name$;\n  }\n$annotate_set$  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:$full_name$)\n}\ninline $type$* $classname$::_internal_mutable_$name$() {\n  if (!_internal_has_$name$()) {\n    clear_$oneof_name$();\n    set_has_$name$();\n    $field_member$ = CreateMaybeMessage< $type$ >(GetArenaForAllocation());\n  }\n  return $field_member$;\n}\ninline $type$* $classname$::mutable_$name$() {\n  $type$* _msg = _internal_mutable_$name$();\n$annotate_mutable$  // @@protoc_insertion_point(field_mutable:$full_name$)\n  return _msg;\n}\n"
            );
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_48.vars_._M_t);
  return;
}

Assistant:

void MessageOneofFieldGenerator::GenerateInlineAccessorDefinitions(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "inline $type$* $classname$::$release_name$() {\n"
      "$annotate_release$"
      "  // @@protoc_insertion_point(field_release:$full_name$)\n"
      "  if (_internal_has_$name$()) {\n"
      "    clear_has_$oneof_name$();\n"
      "      $type$* temp = $field_member$;\n"
      "    if (GetArenaForAllocation() != nullptr) {\n"
      "      temp = ::$proto_ns$::internal::DuplicateIfNonNull(temp);\n"
      "    }\n"
      "    $field_member$ = nullptr;\n"
      "    return temp;\n"
      "  } else {\n"
      "    return nullptr;\n"
      "  }\n"
      "}\n");

  format(
      "inline const $type$& $classname$::_internal_$name$() const {\n"
      "  return _internal_has_$name$()\n"
      "      ? *$field_member$\n"
      "      : reinterpret_cast< $type$&>($type_default_instance$);\n"
      "}\n"
      "inline const $type$& $classname$::$name$() const {\n"
      "$annotate_get$"
      "  // @@protoc_insertion_point(field_get:$full_name$)\n"
      "  return _internal_$name$();\n"
      "}\n"
      "inline $type$* $classname$::unsafe_arena_release_$name$() {\n"
      "$annotate_release$"
      "  // @@protoc_insertion_point(field_unsafe_arena_release"
      ":$full_name$)\n"
      "  if (_internal_has_$name$()) {\n"
      "    clear_has_$oneof_name$();\n"
      "    $type$* temp = $field_member$;\n"
      "    $field_member$ = nullptr;\n"
      "    return temp;\n"
      "  } else {\n"
      "    return nullptr;\n"
      "  }\n"
      "}\n"
      "inline void $classname$::unsafe_arena_set_allocated_$name$"
      "($type$* $name$) {\n"
      // We rely on the oneof clear method to free the earlier contents of
      // this oneof. We can directly use the pointer we're given to set the
      // new value.
      "  clear_$oneof_name$();\n"
      "  if ($name$) {\n"
      "    set_has_$name$();\n"
      "    $field_member$ = $name$;\n"
      "  }\n"
      "$annotate_set$"
      "  // @@protoc_insertion_point(field_unsafe_arena_set_allocated:"
      "$full_name$)\n"
      "}\n"
      "inline $type$* $classname$::_internal_mutable_$name$() {\n"
      "  if (!_internal_has_$name$()) {\n"
      "    clear_$oneof_name$();\n"
      "    set_has_$name$();\n"
      "    $field_member$ = CreateMaybeMessage< $type$ "
      ">(GetArenaForAllocation());\n"
      "  }\n"
      "  return $field_member$;\n"
      "}\n"
      "inline $type$* $classname$::mutable_$name$() {\n"
      "  $type$* _msg = _internal_mutable_$name$();\n"
      "$annotate_mutable$"
      "  // @@protoc_insertion_point(field_mutable:$full_name$)\n"
      "  return _msg;\n"
      "}\n");
}